

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.h
# Opt level: O0

date_time_period * __thiscall
booster::locale::date_time_period_set::operator[](date_time_period_set *this,size_t n)

{
  size_t sVar1;
  undefined8 uVar2;
  ulong in_RSI;
  out_of_range *in_RDI;
  string *s;
  date_time_period_set *in_stack_ffffffffffffffb8;
  undefined1 local_39 [33];
  ulong local_18;
  const_reference local_8;
  
  local_18 = in_RSI;
  sVar1 = size(in_stack_ffffffffffffffb8);
  if (sVar1 <= in_RSI) {
    uVar2 = __cxa_allocate_exception(0x30);
    s = (string *)local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_39 + 1),"Invalid index to date_time_period",(allocator *)s);
    out_of_range::out_of_range(in_RDI,s);
    __cxa_throw(uVar2,&out_of_range::typeinfo,out_of_range::~out_of_range);
  }
  if (local_18 < 4) {
    local_8 = (const_reference)(&in_RDI->super_out_of_range + local_18 * 8);
  }
  else {
    local_8 = std::
              vector<booster::locale::date_time_period,_std::allocator<booster::locale::date_time_period>_>
              ::operator[]((vector<booster::locale::date_time_period,_std::allocator<booster::locale::date_time_period>_>
                            *)&(in_RDI->super_backtrace).frames_.
                               super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                               super__Vector_impl_data._M_finish,local_18 - 4);
  }
  return local_8;
}

Assistant:

date_time_period const &operator[](size_t n) const 
            {
                if(n >= size())
                    throw booster::out_of_range("Invalid index to date_time_period");
                if(n < 4)
                    return basic_[n];
                else
                    return periods_[n-4];
            }